

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_region.cc
# Opt level: O1

void __thiscall S2PointRegion::Encode(S2PointRegion *this,Encoder *encoder)

{
  int i;
  int b;
  double v;
  S2LogMessage SStack_28;
  
  Encoder::Ensure(encoder,0x1e);
  Encoder::put8(encoder,'\x01');
  b = 0;
  do {
    v = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                  ((BasicVector<Vector3,_double,_3UL> *)&this->point_,b);
    Encoder::put64(encoder,(uint64)v);
    b = b + 1;
  } while (b != 3);
  if (encoder->buf_ <= encoder->limit_) {
    return;
  }
  S2LogMessage::S2LogMessage
            (&SStack_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.h"
             ,0xf8,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_28.stream_,"Check failed: (limit_) >= (buf_) ",0x21);
  abort();
}

Assistant:

void S2PointRegion::Encode(Encoder* encoder) const {
  encoder->Ensure(30);  // sufficient

  encoder->put8(kCurrentLosslessEncodingVersionNumber);
  for (int i = 0; i < 3; ++i) {
    encoder->putdouble(point_[i]);
  }
  S2_DCHECK_GE(encoder->avail(), 0);
}